

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_basic.c
# Opt level: O0

int is_sparse_supported(char *path)

{
  int __fd;
  __off_t _Var1;
  char *testfile;
  int r;
  int fd;
  sparse sparse_file [3];
  char *path_local;
  
  sparse_file[2].size = (size_t)path;
  memset(&r,0,0x30);
  r = 1;
  sparse_file[0].type = 0x400;
  sparse_file[0]._4_4_ = 0;
  sparse_file[1].type = 0x2800;
  sparse_file[1]._4_4_ = 0;
  sparse_file[1].size._0_4_ = 2;
  create_sparse_file("can_sparse",(sparse *)&r);
  __fd = open("can_sparse",2);
  if (__fd < 0) {
    path_local._4_4_ = 0;
  }
  else {
    _Var1 = lseek(__fd,0,4);
    close(__fd);
    unlink("can_sparse");
    if ((int)_Var1 < 0) {
      path_local._4_4_ = is_sparse_supported_fiemap((char *)sparse_file[2].size);
    }
    else {
      path_local._4_4_ = 1;
    }
  }
  return path_local._4_4_;
}

Assistant:

static int
is_sparse_supported(const char *path)
{
	const struct sparse sparse_file[] = {
 		/* This hole size is too small to create a sparse
		 * files for almost filesystem. */
		{ HOLE,	 1024 }, { DATA, 10240 },
		{ END,	0 }
	};
	int fd, r;
	const char *testfile = "can_sparse";

	(void)path; /* UNUSED */
	create_sparse_file(testfile, sparse_file);
	fd = open(testfile,  O_RDWR);
	if (fd < 0)
		return (0);
	r = lseek(fd, 0, SEEK_HOLE);
	close(fd);
	unlink(testfile);
#if defined(HAVE_LINUX_FIEMAP_H)
	if (r < 0)
		return (is_sparse_supported_fiemap(path));
	return (1);
#else
	return (r >= 0);
#endif
}